

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O1

void __thiscall capnp::SchemaParser::setDiskFilesystem(SchemaParser *this,Filesystem *fs)

{
  MutexGuarded<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> *this_00;
  undefined1 *puVar1;
  bool bVar2;
  Impl *pIVar3;
  Fault f;
  Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> lock;
  DebugComparison<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_&,_const_kj::None_&> _kjCondition;
  
  pIVar3 = (this->impl).ptr;
  this_00 = &pIVar3->compat;
  _kjCondition.left =
       (Maybe<capnp::SchemaParser::DiskFileCompat> *)((ulong)_kjCondition.left & 0xffffffffffffff00)
  ;
  kj::_::Mutex::lock(&this_00->mutex,0,&_kjCondition);
  _kjCondition.left = &(pIVar3->compat).value;
  bVar2 = (pIVar3->compat).value.ptr.isSet;
  _kjCondition.result = (bool)(bVar2 ^ 1);
  _kjCondition.right = (None *)&kj::none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (bVar2 == false) {
    (pIVar3->compat).value.ptr.field_1.value.ownFs.disposer = (Disposer *)0x0;
    (pIVar3->compat).value.ptr.field_1.value.ownFs.ptr = (Filesystem *)0x0;
    (pIVar3->compat).value.ptr.field_1.value.fs = fs;
    puVar1 = (undefined1 *)((long)&(pIVar3->compat).value.ptr.field_1 + 0x20);
    *(undefined4 *)((long)&(pIVar3->compat).value.ptr.field_1 + 0x20) = 0;
    *(undefined8 *)((long)&(pIVar3->compat).value.ptr.field_1 + 0x28) = 0;
    *(undefined1 **)((long)&(pIVar3->compat).value.ptr.field_1 + 0x30) = puVar1;
    *(undefined1 **)((long)&(pIVar3->compat).value.ptr.field_1 + 0x38) = puVar1;
    *(undefined8 *)((long)&(pIVar3->compat).value.ptr.field_1 + 0x40) = 0;
    puVar1 = (undefined1 *)((long)&(pIVar3->compat).value.ptr.field_1 + 0x50);
    *(undefined4 *)((long)&(pIVar3->compat).value.ptr.field_1 + 0x50) = 0;
    *(undefined8 *)((long)&(pIVar3->compat).value.ptr.field_1 + 0x58) = 0;
    *(undefined1 **)((long)&(pIVar3->compat).value.ptr.field_1 + 0x60) = puVar1;
    *(undefined1 **)((long)&(pIVar3->compat).value.ptr.field_1 + 0x68) = puVar1;
    *(undefined8 *)((long)&(pIVar3->compat).value.ptr.field_1 + 0x70) = 0;
    (pIVar3->compat).value.ptr.isSet = true;
    if (this_00 != (MutexGuarded<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> *)0x0) {
      kj::_::Mutex::unlock(&this_00->mutex,EXCLUSIVE,(Waiter *)0x0);
    }
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<capnp::SchemaParser::DiskFileCompat>&,kj::None_const&>&,char_const(&)[54]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-parser.c++"
             ,0x11c,FAILED,"*lock == kj::none",
             "_kjCondition,\"already called parseDiskFile() or setDiskFilesystem()\"",&_kjCondition,
             (char (*) [54])"already called parseDiskFile() or setDiskFilesystem()");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void SchemaParser::setDiskFilesystem(kj::Filesystem& fs) {
  auto lock = impl->compat.lockExclusive();
  KJ_REQUIRE(*lock == kj::none, "already called parseDiskFile() or setDiskFilesystem()");
  lock->emplace(fs);
}